

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

int __thiscall
crnlib::adaptive_arith_data_model::init(adaptive_arith_data_model *this,EVP_PKEY_CTX *ctx)

{
  adaptive_bit_model *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int in_EAX;
  int extraout_EAX;
  uint uVar10;
  ulong uVar11;
  uint in_EDX;
  ulong uVar12;
  ulong uVar13;
  int iVar15;
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  int iVar32;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar33;
  int iVar35;
  undefined1 auVar34 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar38 [16];
  
  if (in_EDX != 1) {
    if (in_EDX == 0) {
      this->m_total_syms = 0;
      paVar1 = (this->m_probs).m_p;
      if (paVar1 == (adaptive_bit_model *)0x0) {
        return in_EAX;
      }
      crnlib_free(paVar1);
      (this->m_probs).m_p = (adaptive_bit_model *)0x0;
      (this->m_probs).m_size = 0;
      (this->m_probs).m_capacity = 0;
      return extraout_EAX;
    }
    if ((in_EDX & in_EDX - 1) == 0) goto LAB_00199fd4;
  }
  uVar10 = in_EDX - 1 >> 0x10 | in_EDX - 1;
  uVar10 = uVar10 >> 8 | uVar10;
  uVar10 = uVar10 >> 4 | uVar10;
  uVar10 = uVar10 >> 2 | uVar10;
  in_EDX = (uVar10 >> 1 | uVar10) + 1;
LAB_00199fd4:
  this->m_total_syms = in_EDX;
  uVar10 = (this->m_probs).m_size;
  uVar11 = (ulong)uVar10;
  if (uVar10 != in_EDX) {
    uVar12 = uVar11;
    if (uVar10 <= in_EDX) {
      if ((this->m_probs).m_capacity < in_EDX) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_probs,in_EDX,uVar10 + 1 == in_EDX,2,
                   vector<crnlib::adaptive_bit_model>::object_mover,false);
        uVar11 = (ulong)(this->m_probs).m_size;
      }
      auVar9 = _DAT_001a70c0;
      auVar8 = _DAT_001a70b0;
      auVar7 = _DAT_001a70a0;
      auVar6 = _DAT_001a7020;
      auVar5 = _DAT_001a7010;
      uVar12 = uVar11;
      if ((uint)uVar11 != in_EDX) {
        paVar1 = (this->m_probs).m_p;
        uVar12 = (ulong)(in_EDX - (uint)uVar11) + 0x7fffffffffffffff;
        uVar13 = uVar12 & 0x7fffffffffffffff;
        uVar12 = (uVar13 - ((uint)uVar12 & 7)) + 8;
        auVar14._8_4_ = (int)uVar13;
        auVar14._0_8_ = uVar13;
        auVar14._12_4_ = (int)(uVar13 >> 0x20);
        uVar13 = 0;
        auVar14 = auVar14 ^ _DAT_001a7020;
        do {
          auVar26._8_4_ = (int)uVar13;
          auVar26._0_8_ = uVar13;
          auVar26._12_4_ = (int)(uVar13 >> 0x20);
          auVar18 = (auVar26 | auVar5) ^ auVar6;
          iVar27 = auVar14._0_4_;
          iVar33 = -(uint)(iVar27 < auVar18._0_4_);
          iVar15 = auVar14._4_4_;
          auVar19._4_4_ = -(uint)(iVar15 < auVar18._4_4_);
          iVar32 = auVar14._8_4_;
          iVar35 = -(uint)(iVar32 < auVar18._8_4_);
          iVar16 = auVar14._12_4_;
          auVar19._12_4_ = -(uint)(iVar16 < auVar18._12_4_);
          auVar29._4_4_ = iVar33;
          auVar29._0_4_ = iVar33;
          auVar29._8_4_ = iVar35;
          auVar29._12_4_ = iVar35;
          auVar36 = pshuflw(in_XMM11,auVar29,0xe8);
          auVar21._4_4_ = -(uint)(auVar18._4_4_ == iVar15);
          auVar21._12_4_ = -(uint)(auVar18._12_4_ == iVar16);
          auVar21._0_4_ = auVar21._4_4_;
          auVar21._8_4_ = auVar21._12_4_;
          auVar38 = pshuflw(in_XMM12,auVar21,0xe8);
          auVar19._0_4_ = auVar19._4_4_;
          auVar19._8_4_ = auVar19._12_4_;
          auVar37 = pshuflw(auVar36,auVar19,0xe8);
          auVar18._8_4_ = 0xffffffff;
          auVar18._0_8_ = 0xffffffffffffffff;
          auVar18._12_4_ = 0xffffffff;
          auVar18 = (auVar37 | auVar38 & auVar36) ^ auVar18;
          auVar18 = packssdw(auVar18,auVar18);
          if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            paVar1[uVar11 + uVar13].m_bit_0_prob = 0x400;
          }
          auVar19 = auVar21 & auVar29 | auVar19;
          auVar18 = packssdw(auVar19,auVar19);
          auVar37._8_4_ = 0xffffffff;
          auVar37._0_8_ = 0xffffffffffffffff;
          auVar37._12_4_ = 0xffffffff;
          auVar18 = packssdw(auVar18 ^ auVar37,auVar18 ^ auVar37);
          if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
            paVar1[uVar11 + uVar13 + 1].m_bit_0_prob = 0x400;
          }
          auVar18 = (auVar26 | auVar9) ^ auVar6;
          iVar33 = -(uint)(iVar27 < auVar18._0_4_);
          auVar34._4_4_ = -(uint)(iVar15 < auVar18._4_4_);
          iVar35 = -(uint)(iVar32 < auVar18._8_4_);
          auVar34._12_4_ = -(uint)(iVar16 < auVar18._12_4_);
          auVar20._4_4_ = iVar33;
          auVar20._0_4_ = iVar33;
          auVar20._8_4_ = iVar35;
          auVar20._12_4_ = iVar35;
          auVar28._4_4_ = -(uint)(auVar18._4_4_ == iVar15);
          auVar28._12_4_ = -(uint)(auVar18._12_4_ == iVar16);
          auVar28._0_4_ = auVar28._4_4_;
          auVar28._8_4_ = auVar28._12_4_;
          auVar34._0_4_ = auVar34._4_4_;
          auVar34._8_4_ = auVar34._12_4_;
          auVar18 = auVar28 & auVar20 | auVar34;
          auVar18 = packssdw(auVar18,auVar18);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar18 = packssdw(auVar18 ^ auVar2,auVar18 ^ auVar2);
          if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            paVar1[uVar11 + uVar13 + 2].m_bit_0_prob = 0x400;
          }
          auVar21 = pshufhw(auVar20,auVar20,0x84);
          auVar29 = pshufhw(auVar28,auVar28,0x84);
          auVar19 = pshufhw(auVar21,auVar34,0x84);
          auVar22._8_4_ = 0xffffffff;
          auVar22._0_8_ = 0xffffffffffffffff;
          auVar22._12_4_ = 0xffffffff;
          auVar22 = (auVar19 | auVar29 & auVar21) ^ auVar22;
          auVar21 = packssdw(auVar22,auVar22);
          if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            paVar1[uVar11 + uVar13 + 3].m_bit_0_prob = 0x400;
          }
          auVar21 = (auVar26 | auVar8) ^ auVar6;
          iVar33 = -(uint)(iVar27 < auVar21._0_4_);
          auVar24._4_4_ = -(uint)(iVar15 < auVar21._4_4_);
          iVar35 = -(uint)(iVar32 < auVar21._8_4_);
          auVar24._12_4_ = -(uint)(iVar16 < auVar21._12_4_);
          auVar30._4_4_ = iVar33;
          auVar30._0_4_ = iVar33;
          auVar30._8_4_ = iVar35;
          auVar30._12_4_ = iVar35;
          auVar18 = pshuflw(auVar18,auVar30,0xe8);
          auVar23._4_4_ = -(uint)(auVar21._4_4_ == iVar15);
          auVar23._12_4_ = -(uint)(auVar21._12_4_ == iVar16);
          auVar23._0_4_ = auVar23._4_4_;
          auVar23._8_4_ = auVar23._12_4_;
          auVar21 = pshuflw(auVar38 & auVar36,auVar23,0xe8);
          in_XMM12 = auVar21 & auVar18;
          auVar24._0_4_ = auVar24._4_4_;
          auVar24._8_4_ = auVar24._12_4_;
          auVar18 = pshuflw(auVar18,auVar24,0xe8);
          auVar36._8_4_ = 0xffffffff;
          auVar36._0_8_ = 0xffffffffffffffff;
          auVar36._12_4_ = 0xffffffff;
          auVar36 = (auVar18 | in_XMM12) ^ auVar36;
          in_XMM11 = packssdw(auVar36,auVar36);
          if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            paVar1[uVar11 + uVar13 + 4].m_bit_0_prob = 0x400;
          }
          auVar24 = auVar23 & auVar30 | auVar24;
          auVar18 = packssdw(auVar24,auVar24);
          auVar38._8_4_ = 0xffffffff;
          auVar38._0_8_ = 0xffffffffffffffff;
          auVar38._12_4_ = 0xffffffff;
          auVar18 = packssdw(auVar18 ^ auVar38,auVar18 ^ auVar38);
          if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            paVar1[uVar11 + uVar13 + 5].m_bit_0_prob = 0x400;
          }
          auVar18 = (auVar26 | auVar7) ^ auVar6;
          iVar27 = -(uint)(iVar27 < auVar18._0_4_);
          auVar31._4_4_ = -(uint)(iVar15 < auVar18._4_4_);
          iVar32 = -(uint)(iVar32 < auVar18._8_4_);
          auVar31._12_4_ = -(uint)(iVar16 < auVar18._12_4_);
          auVar25._4_4_ = iVar27;
          auVar25._0_4_ = iVar27;
          auVar25._8_4_ = iVar32;
          auVar25._12_4_ = iVar32;
          auVar17._4_4_ = -(uint)(auVar18._4_4_ == iVar15);
          auVar17._12_4_ = -(uint)(auVar18._12_4_ == iVar16);
          auVar17._0_4_ = auVar17._4_4_;
          auVar17._8_4_ = auVar17._12_4_;
          auVar31._0_4_ = auVar31._4_4_;
          auVar31._8_4_ = auVar31._12_4_;
          auVar18 = auVar17 & auVar25 | auVar31;
          auVar18 = packssdw(auVar18,auVar18);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar18 = packssdw(auVar18 ^ auVar3,auVar18 ^ auVar3);
          if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            paVar1[uVar11 + uVar13 + 6].m_bit_0_prob = 0x400;
          }
          auVar26 = pshufhw(auVar25,auVar25,0x84);
          auVar18 = pshufhw(auVar17,auVar17,0x84);
          auVar21 = pshufhw(auVar26,auVar31,0x84);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar18 = packssdw(auVar18 & auVar26,(auVar21 | auVar18 & auVar26) ^ auVar4);
          if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            paVar1[uVar11 + uVar13 + 7].m_bit_0_prob = 0x400;
          }
          uVar13 = uVar13 + 8;
        } while (uVar12 != uVar13);
      }
    }
    uVar10 = (uint)uVar12;
    (this->m_probs).m_size = in_EDX;
  }
  return uVar10;
}

Assistant:

void adaptive_arith_data_model::init(bool, uint total_syms)
    {
        if (!total_syms)
        {
            clear();
            return;
        }

        if ((total_syms < 2) || (!math::is_power_of_2(total_syms)))
        {
            total_syms = math::next_pow2(total_syms);
        }

        m_total_syms = total_syms;

        m_probs.resize(m_total_syms);
    }